

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.hpp
# Opt level: O0

string * cs_impl::to_string<cs::numeric>(numeric *val)

{
  bool bVar1;
  _Setprecision _Var2;
  ostream *this;
  numeric *in_RSI;
  numeric *this_00;
  string *in_RDI;
  longdouble in_ST0;
  string str;
  stringstream ss;
  longlong in_stack_fffffffffffffe48;
  stringstream local_198 [16];
  ostream local_188 [376];
  numeric *local_10;
  
  local_10 = in_RSI;
  bVar1 = cs::numeric::is_integer(in_RSI);
  if (bVar1) {
    cs::numeric::as_integer(local_10);
    std::__cxx11::to_string(in_stack_fffffffffffffe48);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_198);
    std::__cxx11::string::string((string *)&stack0xfffffffffffffe48);
    _Var2 = std::setprecision(*(int *)(cs::current_process + 0x50));
    this_00 = (numeric *)(ulong)(uint)_Var2._M_n;
    this = std::operator<<(local_188,_Var2);
    cs::numeric::as_float((numeric_float *)local_10,this_00);
    std::ostream::operator<<(this,in_ST0);
    std::operator>>((istream *)local_198,(string *)&stack0xfffffffffffffe48);
    std::__cxx11::string::string((string *)in_RDI,(string *)&stack0xfffffffffffffe48);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe48);
    std::__cxx11::stringstream::~stringstream(local_198);
  }
  return in_RDI;
}

Assistant:

std::string to_string<cs::numeric>(const cs::numeric &val)
	{
		if (!val.is_integer()) {
			std::stringstream ss;
			std::string str;
			ss << std::setprecision(cs::current_process->output_precision) << val.as_float();
			ss >> str;
			return std::move(str);
		}
		else
			return std::to_string(val.as_integer());
	}